

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  void **ppvVar4;
  long lVar5;
  int iVar6;
  RepeatedPtrFieldBase temp;
  RepeatedPtrFieldBase local_40;
  
  local_40.arena_ = other->arena_;
  local_40.current_size_ = 0;
  local_40.total_size_ = 0;
  local_40.rep_ = (Rep *)0x0;
  iVar6 = this->current_size_;
  if (iVar6 != 0) {
    pRVar1 = this->rep_;
    ppvVar4 = InternalExtend(&local_40,iVar6);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&local_40,ppvVar4,pRVar1->elements,iVar6,
               (local_40.rep_)->allocated_size - local_40.current_size_);
    iVar6 = iVar6 + local_40.current_size_;
    local_40.current_size_ = iVar6;
    if ((local_40.rep_)->allocated_size < iVar6) {
      (local_40.rep_)->allocated_size = iVar6;
    }
    iVar6 = this->current_size_;
    if (0 < (long)iVar6) {
      pRVar1 = this->rep_;
      lVar5 = 0;
      do {
        puVar2 = (undefined8 *)pRVar1->elements[lVar5];
        lVar5 = lVar5 + 1;
        puVar2[1] = 0;
        *(undefined1 *)*puVar2 = 0;
      } while (iVar6 != lVar5);
      this->current_size_ = 0;
    }
  }
  iVar6 = other->current_size_;
  if (iVar6 != 0) {
    pRVar1 = other->rep_;
    ppvVar4 = InternalExtend(this,iVar6);
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (this,ppvVar4,pRVar1->elements,iVar6,this->rep_->allocated_size - this->current_size_)
    ;
    iVar6 = iVar6 + this->current_size_;
    this->current_size_ = iVar6;
    if (this->rep_->allocated_size < iVar6) {
      this->rep_->allocated_size = iVar6;
    }
  }
  uVar3._0_4_ = other->current_size_;
  uVar3._4_4_ = other->total_size_;
  pRVar1 = other->rep_;
  other->current_size_ = local_40.current_size_;
  other->total_size_ = local_40.total_size_;
  other->rep_ = local_40.rep_;
  local_40._8_8_ = uVar3;
  local_40.rep_ = pRVar1;
  Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_40);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArena() != GetArena());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}